

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuX11.cpp
# Opt level: O2

void __thiscall tcu::x11::XlibWindow::setVisibility(XlibWindow *this,bool visible)

{
  Display *pDVar1;
  int iVar2;
  XEvent event;
  
  if ((this->super_WindowBase).m_visible != visible) {
    pDVar1 = this->m_display->m_display;
    if (visible) {
      XMapWindow();
      iVar2 = 0x13;
    }
    else {
      XUnmapWindow(pDVar1,this->m_window);
      iVar2 = 0x12;
    }
    XSelectInput(pDVar1,this->m_window,0x28000);
    do {
      XWindowEvent(pDVar1,this->m_window,0x28000,&event);
    } while (event.type != iVar2);
    (this->super_WindowBase).m_visible = visible;
  }
  return;
}

Assistant:

void XlibWindow::setVisibility (bool visible)
{
	::Display*	dpy			= m_display.getXDisplay();
	int			eventType	= None;
	XEvent		event;

	if (visible == m_visible)
		return;

	if (visible)
	{
		XMapWindow(dpy, m_window);
		eventType = MapNotify;
	}
	else
	{
		XUnmapWindow(dpy, m_window);
		eventType = UnmapNotify;
	}

	// We are only interested about exposure/structure notify events, not user input
	XSelectInput(dpy, m_window, ExposureMask | StructureNotifyMask);

	do
	{
		XWindowEvent(dpy, m_window, ExposureMask | StructureNotifyMask, &event);
	} while (event.type != eventType);

	m_visible = visible;
}